

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.h
# Opt level: O2

NodeData __thiscall
google::protobuf::compiler::
SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::DFS
          (SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator> *this,
          Descriptor *descriptor)

{
  pointer *pppDVar1;
  int iVar2;
  size_type sVar3;
  LogMessage *pLVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  SCC *scc;
  int iVar7;
  pointer ppDVar8;
  NodeData NVar9;
  LogFinisher local_91;
  Descriptor *dep;
  Descriptor *descriptor_local;
  _Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  local_80;
  Descriptor *scc_desc;
  
  descriptor_local = descriptor;
  sVar3 = std::
          map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::NodeData>_>_>
          ::count(&this->cache_,&descriptor_local);
  if (sVar3 != 0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&scc_desc,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/scc.h"
               ,0x5c);
    pLVar4 = internal::LogMessage::operator<<
                       ((LogMessage *)&scc_desc,"CHECK failed: (cache_.count(descriptor)) == (0): ")
    ;
    internal::LogFinisher::operator=((LogFinisher *)&local_80,pLVar4);
    internal::LogMessage::~LogMessage((LogMessage *)&scc_desc);
  }
  pmVar5 = std::
           map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::NodeData>_>_>
           ::operator[](&this->cache_,&descriptor_local);
  iVar2 = this->index_;
  this->index_ = iVar2 + 1;
  pmVar5->lowlink = iVar2;
  pmVar5->index = iVar2;
  std::
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::push_back(&this->stack_,&descriptor_local);
  cpp::MessageSCCAnalyzer::DepsGenerator::operator()
            ((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
              *)&local_80,(DepsGenerator *)&scc_desc,descriptor_local);
  ppDVar8 = local_80._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppDVar8 == local_80._M_impl.super__Vector_impl_data._M_finish) {
      std::
      _Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ::~_Vector_base(&local_80);
      if (pmVar5->index == pmVar5->lowlink) {
        scc = CreateSCC(this);
        do {
          scc_desc = (this->stack_).
                     super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1];
          std::
          vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
          ::push_back(&scc->descriptors,&scc_desc);
          pppDVar1 = &(this->stack_).
                      super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppDVar1 = *pppDVar1 + -1;
          pmVar6 = std::
                   map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::NodeData>_>_>
                   ::operator[](&this->cache_,&scc_desc);
          pmVar6->scc = scc;
        } while (scc_desc != descriptor_local);
        std::
        __sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor_const**,std::vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::DFS(google::protobuf::Descriptor_const*)::_lambda(google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*)_1_>>
                  ((scc->descriptors).
                   super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (scc->descriptors).
                   super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        AddChildren(this,scc);
      }
      NVar9.scc = pmVar5->scc;
      NVar9.index = pmVar5->index;
      NVar9.lowlink = pmVar5->lowlink;
      return NVar9;
    }
    dep = *ppDVar8;
    if (dep == (Descriptor *)0x0) {
      internal::LogMessage::LogMessage
                ((LogMessage *)&scc_desc,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/scc.h"
                 ,0x66);
      pLVar4 = internal::LogMessage::operator<<((LogMessage *)&scc_desc,"CHECK failed: dep: ");
      internal::LogFinisher::operator=(&local_91,pLVar4);
      internal::LogMessage::~LogMessage((LogMessage *)&scc_desc);
    }
    sVar3 = std::
            map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::NodeData>_>_>
            ::count(&this->cache_,&dep);
    if (sVar3 == 0) {
      NVar9 = DFS(this,dep);
      iVar7 = NVar9.lowlink;
      iVar2 = pmVar5->lowlink;
LAB_0028c67b:
      if (iVar2 < iVar7) {
        iVar7 = iVar2;
      }
      pmVar5->lowlink = iVar7;
    }
    else {
      pmVar6 = std::
               map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::NodeData>_>_>
               ::operator[](&this->cache_,&dep);
      if (pmVar6->scc == (SCC *)0x0) {
        iVar2 = pmVar6->index;
        iVar7 = pmVar5->lowlink;
        goto LAB_0028c67b;
      }
    }
    ppDVar8 = ppDVar8 + 1;
  } while( true );
}

Assistant:

NodeData DFS(const Descriptor* descriptor) {
    // Must not have visited already.
    GOOGLE_DCHECK_EQ(cache_.count(descriptor), 0);

    // Mark visited by inserting in map.
    NodeData& result = cache_[descriptor];
    // Initialize data structures.
    result.index = result.lowlink = index_++;
    stack_.push_back(descriptor);

    // Recurse the fields / nodes in graph
    for (auto dep : DepsGenerator()(descriptor)) {
      GOOGLE_CHECK(dep);
      if (cache_.count(dep) == 0) {
        // unexplored node
        NodeData child_data = DFS(dep);
        result.lowlink = std::min(result.lowlink, child_data.lowlink);
      } else {
        NodeData child_data = cache_[dep];
        if (child_data.scc == nullptr) {
          // Still in the stack_ so we found a back edge
          result.lowlink = std::min(result.lowlink, child_data.index);
        }
      }
    }
    if (result.index == result.lowlink) {
      // This is the root of a strongly connected component
      SCC* scc = CreateSCC();
      while (true) {
        const Descriptor* scc_desc = stack_.back();
        scc->descriptors.push_back(scc_desc);
        // Remove from stack
        stack_.pop_back();
        cache_[scc_desc].scc = scc;

        if (scc_desc == descriptor) break;
      }

      // The order of descriptors is random and depends how this SCC was
      // discovered. In-order to ensure maximum stability we sort it by name.
      std::sort(scc->descriptors.begin(), scc->descriptors.end(),
                [](const Descriptor* a, const Descriptor* b) {
                  return a->full_name() < b->full_name();
                });
      AddChildren(scc);
    }
    return result;
  }